

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupWithConstrCollectAnd_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper,int fFirst)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int fFirst_local;
  Vec_Int_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if (((iVar1 != 0) || (iVar1 = Gia_ObjIsAnd(pObj), iVar1 == 0)) && (fFirst == 0)) {
    iVar1 = Gia_ObjToLit(p,pObj);
    Vec_IntPushUnique(vSuper,iVar1);
    return;
  }
  pGVar2 = Gia_ObjChild0(pObj);
  Gia_ManDupWithConstrCollectAnd_rec(p,pGVar2,vSuper,0);
  pGVar2 = Gia_ObjChild1(pObj);
  Gia_ManDupWithConstrCollectAnd_rec(p,pGVar2,vSuper,0);
  return;
}

Assistant:

void Gia_ManDupWithConstrCollectAnd_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper, int fFirst )
{
    if ( (Gia_IsComplement(pObj) || !Gia_ObjIsAnd(pObj)) && !fFirst )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild0(pObj), vSuper, 0 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild1(pObj), vSuper, 0 );
}